

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Float::stTruncated(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double __x;
  Oop v;
  double integerPart;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  double local_18;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  local_20._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  local_20.uintValue._4_4_ = extraout_var_00;
  bVar1 = Oop::isFloatOrInt((Oop *)&local_20);
  if (bVar1) {
    __x = Oop::decodeFloatOrInt((Oop *)&local_20);
    modf(__x,&local_18);
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x16])(interpreter,(long)local_18);
  }
  else {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  }
  return iVar2;
}

Assistant:

int Float::stTruncated(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto v = interpreter->getReceiver();
    if (!v.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fv = v.decodeFloatOrInt();
    double fractPart, integerPart;
    fractPart = modf(fv, &integerPart);
    return interpreter->returnInteger((SmallIntegerValue)integerPart);
}